

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O0

void __thiscall
simple_state_mgr::simple_state_mgr
          (simple_state_mgr *this,int32 srv_id,
          vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
          *cluster)

{
  char *pcVar1;
  undefined4 in_ESI;
  state_mgr *in_RDI;
  int in_stack_ffffffffffffff4c;
  strfmt<100> *this_00;
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *in_stack_ffffffffffffff98;
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *in_stack_ffffffffffffffa0;
  
  cornerstone::state_mgr::state_mgr(in_RDI);
  in_RDI->_vptr_state_mgr = (_func_int **)&PTR__simple_state_mgr_00247510;
  *(undefined4 *)&in_RDI[1]._vptr_state_mgr = in_ESI;
  std::
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ::vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (strfmt<100> *)(in_RDI + 5);
  std::__cxx11::string::string((string *)this_00);
  cornerstone::strfmt<100>::strfmt((strfmt<100> *)&stack0xffffffffffffff68,"store%d");
  pcVar1 = cornerstone::strfmt<100>::fmt<int>(this_00,in_stack_ffffffffffffff4c);
  std::__cxx11::string::operator=((string *)(in_RDI + 5),pcVar1);
  return;
}

Assistant:

simple_state_mgr(int32 srv_id, const std::vector<ptr<srv_config>>& cluster) : srv_id_(srv_id), cluster_(cluster)
    {
        store_path_ = sstrfmt("store%d").fmt(srv_id_);
    }